

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O2

void __thiscall DummyTest_Empty_Test::TestBody(DummyTest_Empty_Test *this)

{
  char *in_R9;
  AssertHelper AStack_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string local_d8;
  AssertionResult gtest_ar_;
  Deque<int,_std::allocator<int>_> d;
  
  Deque<int,_std::allocator<int>_>::Deque(&d,(allocator<int> *)&local_d8);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = d.current_.size_ == 0;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    local_d8._M_dataplus._M_p._0_4_ = 1;
    Deque<int,_std::allocator<int>_>::push_back(&d,(value_type *)&local_d8);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = d.current_.size_ != 0;
    if (d.current_.size_ == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_d8,(internal *)&gtest_ar_,(AssertionResult *)"d.empty()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
                 ,0xd,(char *)CONCAT44(local_d8._M_dataplus._M_p._4_4_,
                                       local_d8._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      Deque<int,_std::allocator<int>_>::pop_back(&d);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = d.current_.size_ == 0;
      if (gtest_ar_.success_) goto LAB_00132a12;
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_d8,(internal *)&gtest_ar_,(AssertionResult *)"d.empty()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
                 ,0xf,(char *)CONCAT44(local_d8._M_dataplus._M_p._4_4_,
                                       local_d8._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&gtest_ar_,(AssertionResult *)"d.empty()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
               ,0xb,(char *)CONCAT44(local_d8._M_dataplus._M_p._4_4_,local_d8._M_dataplus._M_p._0_4_
                                    ));
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
  std::__cxx11::string::~string((string *)&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_e0);
LAB_00132a12:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  Deque<int,_std::allocator<int>_>::~Deque(&d);
  return;
}

Assistant:

TEST(DummyTest, Empty) {
    Deque<int> d;
    ASSERT_TRUE(d.empty());
    d.push_back(1);
    ASSERT_FALSE(d.empty());
    d.pop_back();
    ASSERT_TRUE(d.empty());
}